

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<int,_std::allocator<int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  lines_t *this_02;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer pvVar9;
  pointer pfVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  pointer pfVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  pointer p_Var19;
  pointer p_Var20;
  ulong uVar21;
  pointer pvVar22;
  pointer p_Var23;
  pointer p_Var24;
  long lVar25;
  ulong uVar26;
  size_t j;
  mesh_t *pmVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined7 in_register_00000089;
  vertex_index_t *pvVar31;
  size_t k;
  long lVar32;
  ulong uVar33;
  long lVar34;
  size_t i;
  size_t j_1;
  pointer pfVar35;
  face_t *pfVar36;
  shape_t *psVar37;
  bool bVar38;
  float fVar39;
  real_t rVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  long lStack_110;
  uchar local_102;
  byte local_101;
  mesh_t *local_100;
  int material_id_local;
  shape_t *local_f0;
  face_t *local_e8;
  uint local_e0;
  float local_dc;
  vertex_index_t ind [3];
  real_t vx [3];
  value_type local_90;
  value_type local_84;
  value_type local_78;
  real_t vy [3];
  face_t remainingFace;
  
  uVar17 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  material_id_local = material_id;
  local_f0 = shape;
  local_101 = PrimGroup::IsEmpty(prim_group);
  psVar37 = local_f0;
  if (!(bool)local_101) {
    std::__cxx11::string::_M_assign((string *)local_f0);
    pfVar35 = (prim_group->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar14 = (prim_group->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pfVar35 != pfVar14) {
      local_100 = &psVar37->mesh;
      this = &(psVar37->mesh).num_face_vertices;
      this_00 = &(psVar37->mesh).material_ids;
      this_01 = &(psVar37->mesh).smoothing_group_ids;
      local_e0 = (uint)CONCAT71(in_register_00000089,triangulate);
      for (uVar30 = 0; uVar30 < (ulong)((long)pfVar14 - (long)pfVar35 >> 5); uVar30 = uVar30 + 1) {
        pvVar9 = pfVar35[uVar30].vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)pfVar35[uVar30].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0xc;
        if (2 < uVar15) {
          pfVar36 = pfVar35 + uVar30;
          if ((char)uVar17 != '\0') {
            pfVar10 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar28 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar10 >> 2;
            uVar17 = 1;
            pvVar22 = pvVar9;
            while (-uVar15 + uVar17 != 1) {
              lVar32 = (long)pvVar22->v_idx;
              uVar21 = uVar17 + 1;
              if (lVar32 * 3 + 2U < uVar28) {
                if (uVar17 == uVar15) {
                  uVar17 = 0;
                }
                lVar16 = (long)pvVar9[uVar17].v_idx;
                if ((lVar16 * 3 + 2U < uVar28) &&
                   (lVar25 = (long)pvVar9[uVar21 % uVar15].v_idx, lVar25 * 3 + 2U < uVar28)) {
                  fVar41 = pfVar10[lVar16 * 3] - pfVar10[lVar32 * 3];
                  fVar43 = (float)*(undefined8 *)(pfVar10 + lVar16 * 3 + 1);
                  fVar39 = pfVar10[lVar25 * 3 + 1] - fVar43;
                  fVar45 = (float)((ulong)*(undefined8 *)(pfVar10 + lVar16 * 3 + 1) >> 0x20);
                  fVar43 = fVar43 - (float)*(undefined8 *)(pfVar10 + lVar32 * 3 + 1);
                  fVar44 = fVar45 - (float)((ulong)*(undefined8 *)(pfVar10 + lVar32 * 3 + 1) >> 0x20
                                           );
                  fVar45 = pfVar10[lVar25 * 3 + 2] - fVar45;
                  fVar46 = pfVar10[lVar25 * 3] - pfVar10[lVar16 * 3];
                  fVar42 = ABS(fVar43 * fVar45 - fVar39 * fVar44);
                  fVar45 = ABS(fVar44 * fVar46 - fVar45 * fVar41);
                  fVar39 = ABS(fVar39 * fVar41 - fVar46 * fVar43);
                  if ((1.1920929e-07 < fVar39) ||
                     ((1.1920929e-07 < fVar42 || (1.1920929e-07 < fVar45)))) {
                    if (fVar39 < fVar42) {
                      lStack_110 = 1;
                      lVar32 = lStack_110;
                      lStack_110 = 2;
                      if (fVar45 < fVar42) goto LAB_00146387;
                    }
                    auVar12._4_4_ = -(uint)(fVar42 < fVar39);
                    auVar12._0_4_ = -(uint)(fVar42 < fVar39);
                    auVar12._8_4_ = -(uint)(fVar45 < fVar39);
                    auVar12._12_4_ = -(uint)(fVar45 < fVar39);
                    iVar13 = movmskpd(pvVar9[uVar17].v_idx * 3,auVar12);
                    lStack_110 = (ulong)(iVar13 != 3) + 1;
                    lVar32 = 0;
                    goto LAB_00146387;
                  }
                }
              }
              pvVar22 = pvVar22 + 1;
              uVar17 = uVar21;
            }
            lVar32 = 1;
            lStack_110 = 2;
LAB_00146387:
            local_dc = 0.0;
            uVar17 = 0;
LAB_0014638c:
            pvVar22 = pvVar9 + uVar17;
            do {
              uVar17 = uVar17 + 1;
              if (-uVar15 + uVar17 == 1) {
                local_e8 = pfVar36;
                face_t::face_t(&remainingFace,pfVar36);
                ind[1].vt_idx = -1;
                ind[1].vn_idx = -1;
                ind[2].v_idx = -1;
                ind[2].vt_idx = -1;
                ind[0].v_idx = -1;
                ind[0].vt_idx = -1;
                ind[0].vn_idx = -1;
                ind[1].v_idx = -1;
                ind[2].vn_idx = -1;
                uVar15 = ((long)(pfVar36->vertex_indices).
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pfVar36->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                uVar28 = 0;
                uVar17 = ((long)remainingFace.vertex_indices.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)remainingFace.vertex_indices.
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                goto LAB_00146488;
              }
              uVar21 = 0;
              if (uVar17 != uVar15) {
                uVar21 = uVar17;
              }
              lVar16 = (long)pvVar22->v_idx * 3;
              uVar29 = lVar16 + lVar32;
              if ((uVar29 < uVar28) && (uVar26 = lVar16 + lStack_110, uVar26 < uVar28)) {
                lVar16 = (long)pvVar9[uVar21].v_idx * 3;
                uVar21 = lVar16 + lVar32;
                if ((uVar21 < uVar28) && (uVar33 = lVar16 + lStack_110, uVar33 < uVar28))
                goto LAB_001463ee;
              }
              pvVar22 = pvVar22 + 1;
            } while( true );
          }
          lVar32 = 4;
          uVar17 = uVar15;
          while (bVar38 = uVar17 != 0, uVar17 = uVar17 - 1, bVar38) {
            pvVar9 = (pfVar36->vertex_indices).
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ind[0].v_idx = *(int *)((long)pvVar9 + lVar32 + -4);
            uVar4 = *(undefined8 *)((long)&pvVar9->v_idx + lVar32);
            ind[0].vn_idx = (int)uVar4;
            ind[0].vt_idx = (int)((ulong)uVar4 >> 0x20);
            std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                      (&local_100->indices,(value_type *)ind);
            lVar32 = lVar32 + 0xc;
          }
          ind[0].v_idx = CONCAT31(ind[0].v_idx._1_3_,(char)uVar15);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this,(uchar *)ind);
          std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_01,&pfVar36->smoothing_group_id);
          uVar17 = (ulong)local_e0;
          psVar37 = local_f0;
        }
LAB_00146887:
        pfVar35 = (prim_group->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar14 = (prim_group->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(psVar37->mesh).tags,tags);
    }
    p_Var23 = (prim_group->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var19 = (prim_group->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (p_Var23 != p_Var19) {
      this_02 = &local_f0->lines;
      local_e8 = (face_t *)&(local_f0->lines).num_line_vertices;
      pmVar27 = (mesh_t *)0x0;
      while (pmVar27 < (undefined1 *)(((long)p_Var19 - (long)p_Var23) / 0x18)) {
        lVar32 = 4;
        uVar17 = 0;
        local_100 = pmVar27;
        while( true ) {
          pvVar9 = p_Var23[(long)pmVar27].vertex_indices.
                   super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = ((long)p_Var23[(long)pmVar27].vertex_indices.
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0xc;
          if (uVar30 <= uVar17) break;
          ind[0].v_idx = *(int *)((long)pvVar9 + lVar32 + -4);
          uVar4 = *(undefined8 *)((long)&pvVar9->v_idx + lVar32);
          ind[0].vn_idx = (int)uVar4;
          ind[0].vt_idx = (int)((ulong)uVar4 >> 0x20);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    (&this_02->indices,(value_type *)ind);
          uVar17 = uVar17 + 1;
          p_Var23 = (prim_group->lineGroup).
                    super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar32 = lVar32 + 0xc;
        }
        ind[0].v_idx = (int)uVar30;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)local_e8,&ind[0].v_idx);
        p_Var23 = (prim_group->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var19 = (prim_group->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pmVar27 = (mesh_t *)
                  ((long)&(local_100->indices).
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    p_Var24 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var20 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (p_Var24 != p_Var20) {
      local_f0 = (shape_t *)&local_f0->points;
      for (uVar17 = 0; uVar17 < (ulong)(((long)p_Var20 - (long)p_Var24) / 0x18); uVar17 = uVar17 + 1
          ) {
        lVar32 = 4;
        uVar30 = 0;
        while( true ) {
          pvVar9 = p_Var24[uVar17].vertex_indices.
                   super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)p_Var24[uVar17].vertex_indices.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0xc) <=
              uVar30) break;
          ind[0].v_idx = *(int *)((long)pvVar9 + lVar32 + -4);
          uVar4 = *(undefined8 *)((long)&pvVar9->v_idx + lVar32);
          ind[0].vn_idx = (int)uVar4;
          ind[0].vt_idx = (int)((ulong)uVar4 >> 0x20);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)local_f0,
                     (value_type *)ind);
          uVar30 = uVar30 + 1;
          p_Var24 = (prim_group->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar32 = lVar32 + 0xc;
        }
        p_Var20 = (prim_group->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  return (bool)(local_101 ^ 1);
LAB_00146488:
  pvVar9 = remainingFace.vertex_indices.
           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar37 = local_f0;
  lVar16 = (long)remainingFace.vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)remainingFace.vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar21 = lVar16 / 0xc;
  pfVar10 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  uVar29 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pfVar10 >> 2;
  while( true ) {
    if ((uVar21 < 4) || (uVar15 == 0)) {
      uVar17 = (ulong)local_e0;
      if (lVar16 == 0x24) {
        local_78.vertex_index = pvVar9->v_idx;
        local_84.vertex_index = pvVar9[1].v_idx;
        local_90.vertex_index = pvVar9[2].v_idx;
        uVar1 = pvVar9->vt_idx;
        uVar5 = pvVar9->vn_idx;
        local_78.texcoord_index = uVar1;
        local_78.normal_index = uVar5;
        uVar2 = pvVar9[1].vt_idx;
        uVar6 = pvVar9[1].vn_idx;
        local_84.texcoord_index = uVar2;
        local_84.normal_index = uVar6;
        uVar3 = pvVar9[2].vt_idx;
        uVar7 = pvVar9[2].vn_idx;
        local_90.texcoord_index = uVar3;
        local_90.normal_index = uVar7;
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_78);
        pfVar36 = local_e8;
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_84);
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_100->indices,&local_90);
        local_102 = '\x03';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this,&local_102);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_01,&pfVar36->smoothing_group_id);
      }
      std::_Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
      ~_Vector_base(&remainingFace.vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                   );
      goto LAB_00146887;
    }
    uVar26 = uVar21;
    if (uVar28 < uVar21) {
      uVar26 = 0;
    }
    uVar28 = uVar28 - uVar26;
    pvVar31 = ind;
    for (lVar25 = 0; lVar25 != 3; lVar25 = lVar25 + 1) {
      uVar26 = (uVar28 + lVar25) % uVar21;
      pvVar31->vn_idx = pvVar9[uVar26].vn_idx;
      uVar8 = pvVar9[uVar26].v_idx;
      uVar11 = pvVar9[uVar26].vt_idx;
      pvVar31->v_idx = uVar8;
      pvVar31->vt_idx = uVar11;
      uVar26 = (long)(int)uVar8 * 3 + lVar32;
      if ((uVar26 < uVar29) && (uVar33 = (long)(int)uVar8 * 3 + lStack_110, uVar33 < uVar29)) {
        vx[lVar25] = pfVar10[uVar26];
        rVar40 = pfVar10[uVar33];
      }
      else {
        vx[lVar25] = 0.0;
        rVar40 = 0.0;
      }
      vy[lVar25] = rVar40;
      pvVar31 = pvVar31 + 1;
    }
    uVar15 = uVar15 - 1;
    if (uVar17 != uVar21) {
      uVar15 = uVar21;
    }
    uVar17 = uVar21;
    if (0.0 <= ((vy[2] - vy[1]) * (vx[1] - vx[0]) - (vx[2] - vx[1]) * (vy[1] - vy[0])) * local_dc)
    break;
LAB_0014659d:
    uVar28 = uVar28 + 1;
  }
  for (uVar26 = 3; uVar26 != uVar21; uVar26 = uVar26 + 1) {
    lVar25 = (long)pvVar9[(uVar26 + uVar28) % uVar21].v_idx * 3;
    uVar33 = lVar25 + lVar32;
    if ((uVar33 < uVar29) && (uVar18 = lVar25 + lStack_110, uVar18 < uVar29)) {
      fVar39 = pfVar10[uVar18];
      bVar38 = false;
      lVar25 = 2;
      for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
        fVar41 = vy[lVar34];
        if ((fVar39 < fVar41 == vy[lVar25] <= fVar39) &&
           (pfVar10[uVar33] <
            ((fVar39 - fVar41) * (vx[lVar25] - vx[lVar34])) / (vy[lVar25] - fVar41) + vx[lVar34])) {
          bVar38 = !bVar38;
        }
        lVar25 = lVar34;
      }
      if (bVar38) goto LAB_0014659d;
    }
  }
  local_78.vertex_index = ind[0].v_idx;
  local_78.texcoord_index = (int)ind[0]._4_8_;
  local_78.normal_index = SUB84(ind[0]._4_8_,4);
  local_84.vertex_index = ind[1].v_idx;
  local_84.texcoord_index = ind[1].vt_idx;
  local_84.normal_index = ind[1].vn_idx;
  local_90.vertex_index = ind[2].v_idx;
  local_90.texcoord_index = ind[2].vt_idx;
  local_90.normal_index = ind[2].vn_idx;
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_78);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_84);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_100->indices,&local_90);
  local_102 = '\x03';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this,&local_102);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&material_id_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_01,&local_e8->smoothing_group_id);
  uVar29 = (uVar28 + 1) % uVar21;
  while (uVar26 = uVar29 + 1, uVar26 < uVar21) {
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar29].vn_idx =
         remainingFace.vertex_indices.
         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar26].vn_idx;
    iVar13 = remainingFace.vertex_indices.
             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar26].vt_idx;
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar29].v_idx =
         remainingFace.vertex_indices.
         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar26].v_idx;
    remainingFace.vertex_indices.
    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
    super__Vector_impl_data._M_start[uVar29].vt_idx = iVar13;
    uVar29 = uVar26;
  }
  remainingFace.vertex_indices.
  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
  super__Vector_impl_data._M_finish =
       remainingFace.vertex_indices.
       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl
       .super__Vector_impl_data._M_finish + -1;
  goto LAB_00146488;
LAB_001463ee:
  local_dc = local_dc +
             (pfVar10[uVar29] * pfVar10[uVar33] - pfVar10[uVar21] * pfVar10[uVar26]) * 0.5;
  goto LAB_0014638c;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}